

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPrT.cpp
# Opt level: O3

void __thiscall OpenMD::NPrT::NPrT(NPrT *this,SimInfo *info)

{
  Globals *pGVar1;
  pointer pcVar2;
  int iVar3;
  uint uVar4;
  long *local_48 [2];
  long local_38 [2];
  
  NPT::NPT(&this->super_NPT,info);
  (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NPrT_002f87f0;
  memset(&this->eta,0,0x120);
  pGVar1 = ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_)->simParams_;
  if ((pGVar1->SurfaceTension).super_ParameterBase.empty_ == true) {
    builtin_strncpy(painCave.errMsg + 0x30,"arostat.\n",10);
    builtin_strncpy(painCave.errMsg + 0x20,"ou must set tauB",0x10);
    builtin_strncpy(painCave.errMsg + 0x10,"PT integrator, y",0x10);
    builtin_strncpy(painCave.errMsg,"If you use the N",0x10);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    this->surfaceTension_ = (pGVar1->SurfaceTension).data_ * 1.439326479 * 0.0004184;
    pcVar2 = (pGVar1->PrivilegedAxis).data_._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar2,pcVar2 + (pGVar1->PrivilegedAxis).data_._M_string_length);
    iVar3 = std::__cxx11::string::compare((char *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if (iVar3 == 0) {
      this->axis_ = 0;
      uVar4 = 0;
    }
    else {
      pcVar2 = (pGVar1->PrivilegedAxis).data_._M_dataplus._M_p;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_48,pcVar2,pcVar2 + (pGVar1->PrivilegedAxis).data_._M_string_length)
      ;
      iVar3 = std::__cxx11::string::compare((char *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      if (iVar3 == 0) {
        this->axis_ = 1;
        uVar4 = 1;
      }
      else {
        pcVar2 = (pGVar1->PrivilegedAxis).data_._M_dataplus._M_p;
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_48,pcVar2,
                   pcVar2 + (pGVar1->PrivilegedAxis).data_._M_string_length);
        iVar3 = std::__cxx11::string::compare((char *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
        if (iVar3 == 0) {
          this->axis_ = 2;
          uVar4 = 2;
        }
        else {
          uVar4 = this->axis_;
        }
      }
    }
    this->axis1_ = ((uVar4 + 1) / 3) * -3 + uVar4 + 1;
    this->axis2_ = uVar4 + ((uVar4 + 2) / 3) * -3 + 2;
  }
  return;
}

Assistant:

NPrT::NPrT(SimInfo* info) : NPT(info) {
    Globals* simParams = info_->getSimParams();
    if (!simParams->haveSurfaceTension()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "If you use the NPT integrator, you must set tauBarostat.\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      surfaceTension_ = simParams->getSurfaceTension() *
                        Constants::surfaceTensionConvert *
                        Constants::energyConvert;

      // Default value of privilegedAxis is "z"
      if (simParams->getPrivilegedAxis() == "x")
        axis_ = 0;
      else if (simParams->getPrivilegedAxis() == "y")
        axis_ = 1;
      else if (simParams->getPrivilegedAxis() == "z")
        axis_ = 2;

      // Compute complementary axes to the privileged axis
      axis1_ = (axis_ + 1) % 3;
      axis2_ = (axis_ + 2) % 3;
    }
  }